

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O0

SiameseResult __thiscall
siamese::Encoder::GetStatistics(Encoder *this,uint64_t *statsOut,uint statsCount)

{
  uint uVar1;
  uint in_EDX;
  long in_RSI;
  Allocator *in_RDI;
  uint i;
  uint local_18;
  uint local_14;
  
  local_14 = in_EDX;
  if (9 < in_EDX) {
    local_14 = 9;
  }
  uVar1 = pktalloc::Allocator::GetMemoryAllocatedBytes(in_RDI);
  in_RDI[1].PreferredWindows.PreallocatedData[7] = (WindowHeader *)(ulong)uVar1;
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    *(WindowHeader **)(in_RSI + (ulong)local_18 * 8) =
         in_RDI[1].PreferredWindows.PreallocatedData[(ulong)local_18 - 1];
  }
  return Siamese_Success;
}

Assistant:

SiameseResult Encoder::GetStatistics(uint64_t* statsOut, unsigned statsCount)
{
    if (statsCount > SiameseEncoderStats_Count)
        statsCount = SiameseEncoderStats_Count;

    // Fill in memory allocated
    Stats.Counts[SiameseEncoderStats_MemoryUsed] = TheAllocator.GetMemoryAllocatedBytes();

    for (unsigned i = 0; i < statsCount; ++i)
        statsOut[i] = Stats.Counts[i];

    return Siamese_Success;
}